

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void Cmd_loopsound(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  AActor *ent;
  FSoundID local_4c;
  DVector3 local_48;
  FName local_2c;
  AActor *local_28;
  AActor *icon;
  FSoundID id;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if ((((&players)[(long)consoleplayer * 0x54] != 0) && (!netgame)) &&
     (icon._4_4_ = key, _id = who, iVar1 = FCommandLine::argc(argv), 1 < iVar1)) {
    pcVar2 = FCommandLine::operator[](argv,1);
    FSoundID::FSoundID((FSoundID *)&icon,pcVar2);
    iVar1 = FSoundID::operator_cast_to_int((FSoundID *)&icon);
    if (iVar1 == 0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("\'%s\' is not a sound\n",pcVar2);
    }
    else {
      FName::FName(&local_2c,"SpeakerIcon");
      AActor::PosPlusZ(&local_48,(AActor *)(&players)[(long)consoleplayer * 0x54],32.0);
      ent = Spawn(&local_2c,&local_48,ALLOW_REPLACE);
      if (ent != (AActor *)0x0) {
        local_28 = ent;
        FSoundID::FSoundID(&local_4c,(FSoundID *)&icon);
        S_Sound(ent,0x104,&local_4c,1.0,1.001);
      }
    }
  }
  return;
}

Assistant:

CCMD (loopsound)
{
	if (players[consoleplayer].mo != NULL && !netgame && argv.argc() > 1)
	{
		FSoundID id = argv[1];
		if (id == 0)
		{
			Printf("'%s' is not a sound\n", argv[1]);
		}
		else
		{
			AActor *icon = Spawn("SpeakerIcon", players[consoleplayer].mo->PosPlusZ(32.), ALLOW_REPLACE);
			if (icon != NULL)
			{
				S_Sound(icon, CHAN_BODY | CHAN_LOOP, id, 1.f, ATTN_IDLE);
			}
		}
	}
}